

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O2

size_t __thiscall
jessilib::find<char,true>
          (jessilib *this,basic_string_view<char,_std::char_traits<char>_> in_string,
          char32_t in_codepoint)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  decode_result dVar4;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  
  pcVar1 = in_string._M_str;
  pcVar3 = (char *)in_string._M_len;
  if (this != (jessilib *)0x0) {
    pcVar2 = (char *)0x0;
    for (; this != (jessilib *)0x0; this = this + -(long)pcVar1) {
      in_string_00._M_str = pcVar1;
      in_string_00._M_len = (size_t)pcVar3;
      dVar4 = decode_codepoint_utf8<char>(this,in_string_00);
      pcVar1 = (char *)dVar4.units;
      if (pcVar1 == (char *)0x0) {
        return (size_t)(char *)0xffffffffffffffff;
      }
      if (dVar4.codepoint == (char32_t)in_string._M_str) {
        return (size_t)pcVar2;
      }
      pcVar3 = pcVar3 + (long)pcVar1;
      pcVar2 = pcVar2 + (long)pcVar1;
    }
  }
  return (size_t)(char *)0xffffffffffffffff;
}

Assistant:

size_t find(std::basic_string_view<LhsCharT> in_string, char32_t in_codepoint) {
	// If we don't have anything to search through, there's nothing to be found
	if (in_string.empty()) {
		return decltype(in_string)::npos;
	}

	if constexpr (!CaseSensitive) {
		in_codepoint = fold(in_codepoint);
	}

	size_t codepoints_removed{};
	while (!in_string.empty()) {
		std::basic_string_view<LhsCharT> string = in_string;
		decode_result string_front = decode_codepoint(string);

		if (string_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return decltype(in_string)::npos;
		}

		if constexpr (CaseSensitive) {
			if (string_front.codepoint == in_codepoint) {
				// Match found!
				return codepoints_removed;
			}
		}
		else {
			if (fold(string_front.codepoint) == in_codepoint) {
				// Match found!
				return codepoints_removed;
			}
		}

		// Didn't find a match here; remove the front codepoint and try the next position
		in_string.remove_prefix(string_front.units);
		codepoints_removed += string_front.units;
	}

	// We reached the end of in_string before finding the prefix :(
	return decltype(in_string)::npos;
}